

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall Memory::HeapBlockMap32::ResetDirtyPages(HeapBlockMap32 *this,Recycler *recycler)

{
  HeapBlockType HVar1;
  L2MapChunk *pLVar2;
  HeapBlock *pHVar3;
  PageAllocatorBaseCommon *pPVar4;
  size_t sVar5;
  code *pcVar6;
  bool bVar7;
  int iVar8;
  undefined4 *puVar9;
  undefined4 extraout_var;
  IdleDecommitPageAllocator *pIVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char *address;
  IdleDecommitPageAllocator *pIVar14;
  char *pcVar15;
  char *pcVar16;
  Segment *pSVar17;
  HeapInfo *this_00;
  
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  lVar12 = 0;
  pSVar17 = (Segment *)0x0;
  do {
    pLVar2 = this->map[lVar12];
    if (pLVar2 != (L2MapChunk *)0x0) {
      lVar13 = 0;
      do {
        pHVar3 = pLVar2->map[lVar13];
        if (pHVar3 != (HeapBlock *)0x0) {
          if (pHVar3->segment == (Segment *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                               ,0x240,"(block->GetSegment() != nullptr)",
                               "block->GetSegment() != nullptr");
            if (!bVar7) goto LAB_006be8e7;
            *puVar9 = 0;
          }
          if (pHVar3->segment == pSVar17) {
            if (pSVar17 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x243,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar7) goto LAB_006be8e7;
              *puVar9 = 0;
            }
            if ((pHVar3->address < pSVar17->address) ||
               (pSVar17->address +
                (pSVar17->segmentPageCount - (ulong)pSVar17->secondaryAllocPageCount) * 0x1000 <=
                pHVar3->address)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x244,"(currentSegment->IsInSegment(block->GetAddress()))",
                                 "currentSegment->IsInSegment(block->GetAddress())");
              if (!bVar7) goto LAB_006be8e7;
              *puVar9 = 0;
            }
          }
          else {
            if (pSVar17 != (Segment *)0x0) {
              if ((pSVar17->address <= pHVar3->address) &&
                 (pHVar3->address <
                  pSVar17->address +
                  (pSVar17->segmentPageCount - (ulong)pSVar17->secondaryAllocPageCount) * 0x1000)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar9 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,0x249,
                                   "(currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress()))"
                                   ,
                                   "currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress())"
                                  );
                if (!bVar7) goto LAB_006be8e7;
                *puVar9 = 0;
              }
            }
            pSVar17 = pHVar3->segment;
            if (pSVar17 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x24b,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar7) goto LAB_006be8e7;
              *puVar9 = 0;
            }
            pPVar4 = (pSVar17->super_SegmentBaseCommon).allocator;
            pcVar15 = pSVar17->address;
            sVar5 = pSVar17->segmentPageCount;
            pIVar14 = (IdleDecommitPageAllocator *)&pPVar4[-1].allocatorType;
            if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
              pIVar14 = (IdleDecommitPageAllocator *)0x0;
            }
            iVar8 = (*pHVar3->_vptr_HeapBlock[5])(pHVar3);
            this_00 = (HeapInfo *)CONCAT44(extraout_var,iVar8);
            HVar1 = pHVar3->heapBlockType;
            if (HVar1 < 0xc) {
              if ((0x630U >> (HVar1 & 0x1f) & 1) == 0) {
                if ((0x84U >> (HVar1 & 0x1f) & 1) == 0) {
                  if (HVar1 != 0xb) goto LAB_006be745;
                  pIVar10 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this_00);
                }
                else {
                  pIVar10 = HeapInfo::GetRecyclerLeafPageAllocator(this_00);
                }
              }
              else {
                pIVar10 = HeapInfo::GetRecyclerWithBarrierPageAllocator(this_00);
              }
            }
            else {
LAB_006be745:
              pIVar10 = HeapInfo::GetRecyclerPageAllocator(this_00);
            }
            if (pIVar14 != pIVar10) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x251,
                                 "(segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo()))"
                                 ,
                                 "segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo())"
                                );
              if (!bVar7) goto LAB_006be8e7;
              *puVar9 = 0;
            }
            pcVar16 = (char *)(sVar5 * 0x1000);
            address = pcVar15;
            if (pcVar15 < this->startAddress) {
              if (pcVar16 <= this->startAddress + -(long)pcVar15) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar9 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,600,
                                   "(segmentLength > (size_t)(this->startAddress - segmentStart))",
                                   "segmentLength > (size_t)(this->startAddress - segmentStart)");
                if (!bVar7) goto LAB_006be8e7;
                *puVar9 = 0;
              }
              address = this->startAddress;
              pcVar16 = pcVar15 + ((long)pcVar16 - (long)address);
            }
            lVar11 = (long)address - (long)this->startAddress;
            pcVar15 = (char *)(0x100000000 - lVar11);
            if (pcVar16 + lVar11 < (char *)0x100000001) {
              pcVar15 = pcVar16;
            }
            if (((ulong)pcVar15 & 0xfff) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x26e,"(segmentLength % AutoSystemInfo::PageSize == 0)",
                                 "segmentLength % AutoSystemInfo::PageSize == 0");
              if (!bVar7) {
LAB_006be8e7:
                pcVar6 = (code *)invalidInstructionException();
                (*pcVar6)();
              }
              *puVar9 = 0;
            }
            if ((pSVar17->field_0x2c & 2) != 0) {
              RecyclerWriteBarrierManager::ResetWriteBarrier(address,(ulong)pcVar15 >> 0xc);
            }
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x100);
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 0x1000) {
      return;
    }
  } while( true );
}

Assistant:

void
HeapBlockMap32::ResetDirtyPages(Recycler * recycler)
{
    this->ForEachSegment(recycler, [=](char * segmentStart, size_t segmentLength, Segment * segment, PageAllocator * segmentPageAllocator) {

        Assert(segmentLength % AutoSystemInfo::PageSize == 0);

#ifdef RECYCLER_WRITE_WATCH
        if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
        {
            if (segmentPageAllocator->IsWriteWatchEnabled())
            {
                // Call ResetWriteWatch for Small non-leaf and Large segments.
                UINT ret = ::ResetWriteWatch(segmentStart, segmentLength);
                Assert(ret == 0);
            }
        }
#endif

#ifdef RECYCLER_WRITE_BARRIER
#if defined(TARGET_64)
        if (segment->IsWriteBarrierEnabled())
#endif
        {
            // Reset software write barrier for barrier segments.
            RecyclerWriteBarrierManager::ResetWriteBarrier(segmentStart, segmentLength / AutoSystemInfo::PageSize);
        }
#endif
    });
}